

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool BasePort::ParseOptions
               (char *arg,PortType *portType,int *portNum,string *IPaddr,bool *fwBridge,
               ostream *ostr)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  char *arg_00;
  uint local_98;
  uint local_94;
  uint colonPos;
  uint numOffset;
  string local_60 [32];
  ostream *local_40;
  ostream *ostr_local;
  bool *fwBridge_local;
  string *IPaddr_local;
  int *portNum_local;
  PortType *portType_local;
  char *arg_local;
  
  local_40 = ostr;
  ostr_local = (ostream *)fwBridge;
  fwBridge_local = (bool *)IPaddr;
  IPaddr_local = (string *)portNum;
  portNum_local = (int *)portType;
  portType_local = (PortType *)arg;
  if (arg != (char *)0x0) {
    sVar2 = strlen(arg);
    if (sVar2 != 0) {
      iVar1 = strncmp((char *)portType_local,"fw",2);
      if (iVar1 == 0) {
        *portNum_local = 0;
        sVar2 = strlen((char *)portType_local);
        if (sVar2 == 2) {
          *(undefined4 *)IPaddr_local = 0;
          arg_local._7_1_ = 1;
        }
        else if (*(byte *)((long)portType_local + 2) == 0x3a) {
          iVar1 = __isoc99_sscanf((byte *)((long)portType_local + 3),"%d",IPaddr_local);
          if (iVar1 == 1) {
            arg_local._7_1_ = 1;
          }
          else {
            poVar3 = std::operator<<(local_40,
                                     "ParseOptions: failed to find a port number after \"fw:\" in ")
            ;
            poVar3 = std::operator<<(poVar3,(char *)((long)portType_local + 3));
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            arg_local._7_1_ = 0;
          }
        }
        else {
          poVar3 = std::operator<<(local_40,"ParseOptions: missing \":\" after \"fw\"");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          arg_local._7_1_ = 0;
        }
      }
      else {
        iVar1 = strncmp((char *)portType_local,"eth",3);
        if (iVar1 == 0) {
          *portNum_local = 2;
          *ostr_local = (ostream)0x0;
          local_94 = 4;
          iVar1 = strncmp((char *)((long)portType_local + 3),"fw",2);
          if (iVar1 == 0) {
            *ostr_local = (ostream)0x1;
            local_94 = 6;
          }
          iVar1 = __isoc99_sscanf((long)portType_local + (ulong)local_94,"%d",IPaddr_local);
          arg_local._7_1_ = iVar1 == 1;
        }
        else {
          iVar1 = strncmp((char *)portType_local,"udp",3);
          if (iVar1 == 0) {
            *portNum_local = 1;
            *ostr_local = (ostream)0x0;
            local_98 = 3;
            iVar1 = strncmp((char *)((long)portType_local + 3),"fw",2);
            if (iVar1 == 0) {
              *ostr_local = (ostream)0x1;
              local_98 = 5;
            }
            sVar2 = strlen((char *)portType_local);
            if (sVar2 == local_98) {
              std::__cxx11::string::operator=((string *)fwBridge_local,"169.254.0.100");
              arg_local._7_1_ = 1;
            }
            else if (*(char *)((long)portType_local + (ulong)local_98) == ':') {
              sVar2 = strlen((char *)((long)portType_local + (ulong)local_98 + 1));
              if (7 < sVar2) {
                std::__cxx11::string::assign(fwBridge_local);
              }
              arg_local._7_1_ = 1;
            }
            else {
              if (local_98 == 3) {
                poVar3 = std::operator<<(local_40,"ParseOptions: missing \":\" after \"udp\"");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar3 = std::operator<<(local_40,"ParseOptions: missing \":\" after \"udpfw\"");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              }
              arg_local._7_1_ = 0;
            }
          }
          else {
            iVar1 = strncmp((char *)portType_local,"emio",4);
            if (iVar1 == 0) {
              *portNum_local = 3;
              sVar2 = strlen((char *)portType_local);
              if (sVar2 == 4) {
                *(undefined4 *)IPaddr_local = 0;
                arg_local._7_1_ = 1;
              }
              else if ((char)portType_local[1] == 0x3a) {
                iVar1 = __isoc99_sscanf((byte *)((long)portType_local + 5),"%d",IPaddr_local);
                if (iVar1 == 1) {
                  arg_local._7_1_ = 1;
                }
                else {
                  poVar3 = std::operator<<(local_40,
                                           "ParseOptions: failed to find a port number after \"emio:\" in "
                                          );
                  poVar3 = std::operator<<(poVar3,(char *)((long)portType_local + 3));
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  arg_local._7_1_ = 0;
                }
              }
              else {
                poVar3 = std::operator<<(local_40,"ParseOptions: missing \":\" after \"emio\"");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                arg_local._7_1_ = 0;
              }
            }
            else {
              *portNum_local = 0;
              iVar1 = __isoc99_sscanf(portType_local,"%d",IPaddr_local);
              if (iVar1 == 1) {
                arg_local._7_1_ = 1;
              }
              else {
                poVar3 = std::operator<<(local_40,
                                         "ParseOptions: failed to find a FireWire port number in ");
                poVar3 = std::operator<<(poVar3,(char *)portType_local);
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                arg_local._7_1_ = 0;
              }
            }
          }
        }
      }
      goto LAB_001160d8;
    }
  }
  poVar3 = std::operator<<(local_40,"ParseOptions: no option provided, using default ");
  DefaultPort_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_60);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_60);
  DefaultPort_abi_cxx11_();
  arg_00 = (char *)std::__cxx11::string::c_str();
  arg_local._7_1_ =
       ParseOptions(arg_00,(PortType *)portNum_local,(int *)IPaddr_local,(string *)fwBridge_local,
                    (bool *)ostr_local,(ostream *)&std::cerr);
  std::__cxx11::string::~string((string *)&colonPos);
LAB_001160d8:
  return (bool)(arg_local._7_1_ & 1);
}

Assistant:

bool BasePort::ParseOptions(const char *arg, PortType &portType, int &portNum, std::string &IPaddr,
                            bool &fwBridge, std::ostream &ostr)
{
    // no option, using default
    if ((arg == 0) || (strlen(arg) == 0)) {
        ostr << "ParseOptions: no option provided, using default "
             << DefaultPort() << std::endl;
        return ParseOptions(DefaultPort().c_str(), portType, portNum, IPaddr, fwBridge);
    }
    // expecting proper options
    if (strncmp(arg, "fw", 2) == 0) {
        portType = PORT_FIREWIRE;
        // no port specified
        if (strlen(arg) == 2) {
            portNum = 0;
            return true;
        }
        // make sure separator is here
        if (arg[2] != ':') {
            ostr << "ParseOptions: missing \":\" after \"fw\"" << std::endl;
            return false;
        }
        // scan port number
        if (sscanf(arg+3, "%d", &portNum) == 1) {
            return true;
        }
        ostr << "ParseOptions: failed to find a port number after \"fw:\" in " << arg+3 << std::endl;
        return false;
    }
    else if (strncmp(arg, "eth", 3) == 0) {
        portType = PORT_ETH_RAW;
        fwBridge = false;
        unsigned int numOffset = 4;
        if (strncmp(arg+3, "fw", 2) == 0) {
            fwBridge = true;
            numOffset += 2;
        }
        return (sscanf(arg+numOffset, "%d", &portNum) == 1);
    }
    else if (strncmp(arg, "udp", 3) == 0) {
        portType = PORT_ETH_UDP;
        fwBridge = false;
        unsigned int colonPos = 3;
        if (strncmp(arg+3, "fw", 2) == 0) {
            fwBridge = true;
            colonPos += 2;
        }
        // no option specified
        if (strlen(arg) == colonPos) {
            IPaddr = ETH_UDP_DEFAULT_IP;
            return true;
        }
        // make sure separator is here
        if (arg[colonPos] != ':') {
            if (colonPos == 3)
                ostr << "ParseOptions: missing \":\" after \"udp\"" << std::endl;
            else
                ostr << "ParseOptions: missing \":\" after \"udpfw\"" << std::endl;
            return false;
        }
        // For now, if at least 8 characters, assume a valid IP address
        if (strlen(arg+colonPos+1) >= 8)
            IPaddr.assign(arg+colonPos+1);
        return true;
    }
    else if (strncmp(arg, "emio", 4) == 0) {
        portType = PORT_ZYNQ_EMIO;
        // no port specified
        if (strlen(arg) == 4) {
            portNum = 0;
            return true;
        }
        // make sure separator is here
        if (arg[4] != ':') {
            ostr << "ParseOptions: missing \":\" after \"emio\"" << std::endl;
            return false;
        }
        // scan port number
        if (sscanf(arg+5, "%d", &portNum) == 1) {
            return true;
        }
        ostr << "ParseOptions: failed to find a port number after \"emio:\" in " << arg+3 << std::endl;
        return false;
    }
    // older default, fw and looking for port number
    portType = PORT_FIREWIRE;
    // scan port number
    if (sscanf(arg, "%d", &portNum) == 1) {
        return true;
    }
    ostr << "ParseOptions: failed to find a FireWire port number in " << arg << std::endl;
    return false;
}